

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O0

void llb_buildsystem_command_interface_task_needs_input
               (llb_task_interface_t ti,llb_build_key_t *key,uintptr_t inputID)

{
  BuildKey *this;
  KeyType local_50;
  TaskInterface *local_30;
  TaskInterface *coreti;
  uintptr_t inputID_local;
  llb_build_key_t *key_local;
  llb_task_interface_t ti_local;
  
  ti_local.impl = ti.ctx;
  key_local = (llb_build_key_t *)ti.impl;
  local_30 = (TaskInterface *)&key_local;
  coreti = (TaskInterface *)inputID;
  inputID_local = (uintptr_t)key;
  this = anon_unknown.dwarf_1b8a13::CAPIBuildKey::getInternalBuildKey((CAPIBuildKey *)key);
  llbuild::buildsystem::BuildKey::toData(&local_50,this);
  llbuild::core::TaskInterface::request((TaskInterface *)&key_local,&local_50,(uintptr_t)coreti);
  llbuild::core::KeyType::~KeyType(&local_50);
  return;
}

Assistant:

void llb_buildsystem_command_interface_task_needs_input(llb_task_interface_t ti, llb_build_key_t* key, uintptr_t inputID) {
  auto coreti = reinterpret_cast<core::TaskInterface*>(&ti);
  coreti->request(((CAPIBuildKey *)key)->getInternalBuildKey().toData(), inputID);
}